

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_frame.cc
# Opt level: O2

pair<bool,_std::unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>_>
__thiscall pstack::Dwarf::CFI::putFDEorCIE(CFI *this,DWARFReader *reader)

{
  Addr offset;
  _Base_ptr end;
  iterator iVar1;
  undefined4 extraout_var;
  DWARFReader *in_RDX;
  FDE *extraout_RDX;
  __uniq_ptr_data<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>,_true,_true>
  extraout_RDX_00;
  _Tuple_impl<0UL,_pstack::Dwarf::FDE_*,_std::default_delete<pstack::Dwarf::FDE>_> extraout_RDX_01;
  _Head_base<0UL,_pstack::Dwarf::FDE_*,_false> _Var2;
  pair<bool,_std::unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>_> pVar3;
  Info *local_90;
  unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_> fde;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_78;
  undefined4 local_70;
  __shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2> local_68;
  _Base_ptr local_50;
  Off nextoff;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  Info *local_38;
  Off associatedCIE;
  
  offset = in_RDX->off;
  end = (_Base_ptr)decodeCIEFDEHdr((CFI *)reader,in_RDX,(FIType)reader[1].off,(Off *)&local_38);
  if (end == (_Base_ptr)0x0) {
    *(undefined1 *)
     &(this->io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr = 0;
    _Var2._M_head_impl = extraout_RDX;
  }
  else {
    local_50 = end;
    if (local_38 != (Info *)0xffffffffffffffff) {
      iVar1 = std::
              _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_pstack::Dwarf::CIE>,_std::_Select1st<std::pair<const_unsigned_long,_pstack::Dwarf::CIE>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_pstack::Dwarf::CIE>_>_>
              ::find((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_pstack::Dwarf::CIE>,_std::_Select1st<std::pair<const_unsigned_long,_pstack::Dwarf::CIE>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_pstack::Dwarf::CIE>_>_>
                      *)&reader[1].end,(key_type_conflict *)&local_38);
      if (iVar1._M_node == (_Base_ptr)&reader[1].io) {
        std::__shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_68,
                   (__shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2> *)reader);
        local_90 = local_38;
        fde._M_t.super___uniq_ptr_impl<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>
        ._M_t.super__Tuple_impl<0UL,_pstack::Dwarf::FDE_*,_std::default_delete<pstack::Dwarf::FDE>_>
        .super__Head_base<0UL,_pstack::Dwarf::FDE_*,_false>._M_head_impl._0_4_ =
             (*(local_68._M_ptr)->_vptr_Reader[8])();
        fde._M_t.super___uniq_ptr_impl<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>
        ._M_t.super__Tuple_impl<0UL,_pstack::Dwarf::FDE_*,_std::default_delete<pstack::Dwarf::FDE>_>
        .super__Head_base<0UL,_pstack::Dwarf::FDE_*,_false>._M_head_impl._4_4_ = extraout_var;
        _Stack_78._M_pi = local_68._M_refcount._M_pi;
        local_68._M_ptr = (element_type *)0x0;
        local_68._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_70 = 8;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
        putFDEorCIE((CFI *)&nextoff,reader);
        if (((char)nextoff != '\x01') ||
           (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
          __assert_fail("success && notAnFde == nullptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/dwarf_frame.cc"
                        ,0x7a,
                        "std::pair<bool, std::unique_ptr<FDE>> pstack::Dwarf::CFI::putFDEorCIE(DWARFReader &) const"
                       );
        }
        std::unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>::~unique_ptr
                  ((unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_> *)
                   &local_40);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_78);
      }
      std::
      make_unique<pstack::Dwarf::FDE,pstack::Dwarf::CFI_const&,pstack::Dwarf::DWARFReader&,unsigned_long&,unsigned_long&>
                ((CFI *)&local_90,reader,&in_RDX->off,(unsigned_long *)&local_38);
      DWARFReader::setOffset(in_RDX,(Off)local_50);
      *(undefined1 *)
       &(this->io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr = 1;
      (this->io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90;
      local_90 = (Info *)0x0;
      std::unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>::~unique_ptr
                ((unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_> *)
                 &local_90);
      _Var2._M_head_impl =
           (FDE *)extraout_RDX_00.
                  super___uniq_ptr_impl<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_pstack::Dwarf::FDE_*,_std::default_delete<pstack::Dwarf::FDE>_>
                  .super__Head_base<0UL,_pstack::Dwarf::FDE_*,_false>._M_head_impl;
      goto LAB_00153cce;
    }
    putCIE((CFI *)reader,offset,in_RDX,(Addr)end);
    DWARFReader::setOffset(in_RDX,(Off)end);
    *(undefined1 *)
     &(this->io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr = 1;
    _Var2 = extraout_RDX_01.super__Head_base<0UL,_pstack::Dwarf::FDE_*,_false>._M_head_impl;
  }
  (this->io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_00153cce:
  pVar3.second._M_t.
  super___uniq_ptr_impl<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>._M_t.
  super__Tuple_impl<0UL,_pstack::Dwarf::FDE_*,_std::default_delete<pstack::Dwarf::FDE>_>.
  super__Head_base<0UL,_pstack::Dwarf::FDE_*,_false>._M_head_impl =
       (__uniq_ptr_data<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>,_true,_true>)
       (__uniq_ptr_data<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>,_true,_true>)
       _Var2._M_head_impl;
  pVar3._0_8_ = this;
  return pVar3;
}

Assistant:

std::pair<bool, std::unique_ptr<FDE>>
CFI::putFDEorCIE( DWARFReader &reader ) const {
   size_t startOffset = reader.getOffset();
   Elf::Off associatedCIE;
   Elf::Off nextoff = decodeCIEFDEHdr(reader, type, &associatedCIE);
   if (nextoff == 0)
      return { false, nullptr };
   if (associatedCIE == Elf::Off(-1)) {
      putCIE(startOffset, reader, nextoff);
      reader.setOffset( nextoff );
      return { true, nullptr };
   } else {
      if (cies.find(associatedCIE) == cies.end()) {
         DWARFReader r2( io, associatedCIE );
         auto [ success, notAnFde ] = putFDEorCIE(r2);
         assert(success && notAnFde == nullptr);
      }
      std::unique_ptr<FDE> fde = std::make_unique<FDE>(*this, reader, associatedCIE, nextoff);
      reader.setOffset( nextoff );
      return {true, std::move(fde) };
   }
}